

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O0

int SUNLinSolSetup_Band(SUNLinearSolver S,SUNMatrix A)

{
  undefined8 uVar1;
  long *in_RSI;
  long *in_RDI;
  sunindextype *pivots;
  sunrealtype **A_cols;
  SUNContext_conflict sunctx_local_scope_;
  undefined4 local_4;
  
  uVar1 = SUNDlsMat_bandGBTRF(*(undefined8 *)(*in_RSI + 0x40),*(undefined8 *)(*in_RSI + 8),
                              *(undefined8 *)(*in_RSI + 0x18),*(undefined8 *)(*in_RSI + 0x20),
                              *(undefined8 *)(*in_RSI + 0x28),*(undefined8 *)(*in_RDI + 8));
  *(undefined8 *)(*in_RDI + 0x10) = uVar1;
  if (*(long *)(*in_RDI + 0x10) < 1) {
    local_4 = 0;
  }
  else {
    local_4 = 0x328;
  }
  return local_4;
}

Assistant:

int SUNLinSolSetup_Band(SUNLinearSolver S, SUNMatrix A)
{
  SUNFunctionBegin(S->sunctx);
  sunrealtype** A_cols;
  sunindextype* pivots;

  SUNAssert(A, SUN_ERR_ARG_CORRUPT);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  pivots = NULL;
  A_cols = SM_COLS_B(A);
  pivots = PIVOTS(S);
  SUNAssert(A_cols, SUN_ERR_ARG_CORRUPT);
  SUNAssert(pivots, SUN_ERR_ARG_CORRUPT);

  /* ensure that storage upper bandwidth is sufficient for fill-in */
  SUNAssert(SM_SUBAND_B(A) >=
              SUNMIN(SM_COLUMNS_B(A) - 1, SM_UBAND_B(A) + SM_LBAND_B(A)),
            SUN_ERR_ARG_INCOMPATIBLE);

  /* perform LU factorization of input matrix */
  LASTFLAG(S) = SUNDlsMat_bandGBTRF(A_cols, SM_COLUMNS_B(A), SM_UBAND_B(A),
                                    SM_LBAND_B(A), SM_SUBAND_B(A), pivots);

  /* store error flag (if nonzero, that row encountered zero-valued pivot) */
  if (LASTFLAG(S) > 0) { return (SUNLS_LUFACT_FAIL); }
  return SUN_SUCCESS;
}